

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

bool divsufsortxx::helper::
     partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first1,
               iterator first2,iterator last,iterator *mfirst,iterator *mlast,value_type *v)

{
  iterator __b;
  iterator __b_00;
  iterator __b_01;
  iterator __b_02;
  iterator __b_03;
  iterator first2_00;
  iterator first2_01;
  iterator __a;
  iterator __a_00;
  iterator __a_01;
  iterator __a_02;
  iterator __a_03;
  iterator last1;
  iterator last1_00;
  iterator first1_00;
  iterator first1_01;
  bool bVar1;
  bool bVar2;
  iterator *piVar3;
  difference_type dVar4;
  pos_type in_RSI;
  BitmapArray<long> *in_RDI;
  iterator *in_stack_00000020;
  iterator *in_stack_00000028;
  char *in_stack_00000030;
  value_type x;
  iterator d;
  iterator c;
  iterator b;
  iterator a;
  iterator *in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb2;
  undefined1 in_stack_fffffffffffffdb3;
  undefined1 in_stack_fffffffffffffdb4;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 uVar6;
  iterator *this;
  BitmapArray<long> *in_stack_fffffffffffffdc0;
  BitmapArray<long> *in_stack_fffffffffffffdc8;
  BitmapArray<long> *in_stack_fffffffffffffdd0;
  BitmapArray<long> *in_stack_fffffffffffffdd8;
  BitmapArray<long> *in_stack_fffffffffffffde0;
  BitmapArray<long> *in_stack_fffffffffffffde8;
  pos_type in_stack_fffffffffffffdf0;
  long local_1f0;
  iterator local_1e8;
  difference_type local_1d8;
  iterator local_1d0;
  BitmapArray<long> *local_1c0;
  pos_type local_1b8;
  BitmapArray<long> *local_1b0;
  pos_type local_1a8;
  difference_type local_1a0;
  difference_type local_198;
  iterator local_190;
  iterator local_180;
  BitmapArray<long> *local_170;
  pos_type local_168;
  reference local_160;
  iterator local_150;
  BitmapArray<long> *local_140;
  pos_type local_138;
  reference local_130;
  BitmapArray<long> *local_120;
  pos_type local_118;
  BitmapArray<long> *local_110;
  pos_type local_108;
  iterator local_100;
  BitmapArray<long> *local_f0;
  pos_type local_e8;
  reference local_e0;
  reference local_d0;
  iterator local_c0;
  BitmapArray<long> *local_b0;
  pos_type local_a8;
  reference local_a0;
  reference local_90;
  value_type local_79;
  iterator local_78;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  iterator local_18;
  
  this = (iterator *)&stack0x00000008;
  local_18.array_ = in_RDI;
  local_18.pos_ = in_RSI;
  bitmap::BitmapArray<long>::iterator::iterator(&local_48);
  bitmap::BitmapArray<long>::iterator::iterator(&local_58);
  bitmap::BitmapArray<long>::iterator::iterator(&local_68);
  bitmap::BitmapArray<long>::iterator::iterator(&local_78);
  local_79 = '\0';
  bitmap::BitmapArray<long>::iterator::operator=(&local_58,&local_28);
  while( true ) {
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,&local_38);
    uVar6 = false;
    if (bVar1) {
      local_90 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11a4ee);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11a50b);
      local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                 operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                            in_stack_fffffffffffffdc0,(size_type)this);
      uVar6 = local_79 == *in_stack_00000030;
    }
    if ((bool)uVar6 == false) break;
    bitmap::BitmapArray<long>::iterator::operator++(&local_58);
  }
  piVar3 = bitmap::BitmapArray<long>::iterator::operator=(&local_48,&local_58);
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,&local_38);
  if ((bVar1) && (local_79 < *in_stack_00000030)) {
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator++(&local_58);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,&local_38);
      bVar1 = false;
      if (bVar2) {
        local_a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11a5d8);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11a5f5);
        local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                   operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                              in_stack_fffffffffffffdc0,(size_type)this);
        bVar1 = local_79 <= *in_stack_00000030;
      }
      if (!bVar1) break;
      if (local_79 == *in_stack_00000030) {
        local_b0 = local_58.array_;
        local_a8 = local_58.pos_;
        local_c0 = bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffda8,0);
        __a.pos_ = (pos_type)in_stack_fffffffffffffde0;
        __a.array_ = in_stack_fffffffffffffdd8;
        __b.pos_ = (pos_type)in_stack_fffffffffffffdd0;
        __b.array_ = in_stack_fffffffffffffdc8;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a,__b);
      }
    }
    in_stack_fffffffffffffdb6 = 0;
  }
  bitmap::BitmapArray<long>::iterator::operator=(&local_68,&local_38);
  do {
    piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
    uVar5 = false;
    if (bVar1) {
      local_d0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11a6fd);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11a71a);
      local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                 operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                            in_stack_fffffffffffffdc0,(size_type)this);
      uVar5 = local_79 == *in_stack_00000030;
    }
  } while ((bool)uVar5 != false);
  piVar3 = bitmap::BitmapArray<long>::iterator::operator=(&local_78,&local_68);
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
  if ((bVar1) && (*in_stack_00000030 < local_79)) {
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
      bVar1 = false;
      if (bVar2) {
        local_e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11a7d8);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11a7f5);
        local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                   operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                              in_stack_fffffffffffffdc0,(size_type)this);
        bVar1 = *in_stack_00000030 <= local_79;
      }
      if (!bVar1) break;
      if (local_79 == *in_stack_00000030) {
        local_f0 = local_68.array_;
        local_e8 = local_68.pos_;
        local_100 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffffda8,0);
        __a_00.pos_ = (pos_type)in_stack_fffffffffffffde0;
        __a_00.array_ = in_stack_fffffffffffffdd8;
        __b_00.pos_ = (pos_type)in_stack_fffffffffffffdd0;
        __b_00.array_ = in_stack_fffffffffffffdc8;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_00,__b_00);
      }
    }
    in_stack_fffffffffffffdb4 = 0;
  }
  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,&local_68), bVar1) {
    local_110 = local_58.array_;
    local_108 = local_58.pos_;
    local_120 = local_68.array_;
    local_118 = local_68.pos_;
    __a_01.pos_ = (pos_type)in_stack_fffffffffffffde0;
    __a_01.array_ = in_stack_fffffffffffffdd8;
    __b_01.pos_ = (pos_type)in_stack_fffffffffffffdd0;
    __b_01.array_ = in_stack_fffffffffffffdc8;
    std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (__a_01,__b_01);
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator++(&local_58);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,&local_68);
      bVar1 = false;
      if (bVar2) {
        local_130 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11a96d);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11a98a);
        local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                   operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                              in_stack_fffffffffffffdc0,(size_type)this);
        bVar1 = local_79 <= *in_stack_00000030;
      }
      if (!bVar1) break;
      if (local_79 == *in_stack_00000030) {
        local_140 = local_58.array_;
        local_138 = local_58.pos_;
        local_150 = bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffda8,0);
        __a_02.pos_ = (pos_type)in_stack_fffffffffffffde0;
        __a_02.array_ = in_stack_fffffffffffffdd8;
        __b_02.pos_ = (pos_type)in_stack_fffffffffffffdd0;
        __b_02.array_ = in_stack_fffffffffffffdc8;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_02,__b_02);
      }
    }
    in_stack_fffffffffffffdb3 = 0;
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
      bVar1 = false;
      if (bVar2) {
        local_160 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11aa7d);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11aa9a);
        local_79 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::
                   operator[]((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
                              in_stack_fffffffffffffdc0,(size_type)this);
        bVar1 = *in_stack_00000030 <= local_79;
      }
      if (!bVar1) break;
      if (local_79 == *in_stack_00000030) {
        local_170 = local_68.array_;
        local_168 = local_68.pos_;
        local_180 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffffda8,0);
        __a_03.pos_ = (pos_type)in_stack_fffffffffffffde0;
        __a_03.array_ = in_stack_fffffffffffffdd8;
        __b_03.pos_ = (pos_type)in_stack_fffffffffffffdd0;
        __b_03.array_ = in_stack_fffffffffffffdc8;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_03,__b_03);
      }
    }
    in_stack_fffffffffffffdb2 = 0;
  }
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                    ((iterator *)
                     CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                             CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffdb4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffdb3,
                                                  CONCAT12(in_stack_fffffffffffffdb2,
                                                           in_stack_fffffffffffffdb0)))))),
                     in_stack_fffffffffffffda8);
  if (bVar1) {
    local_198 = bitmap::BitmapArray<long>::iterator::operator-(&local_48,&local_18);
    local_1a0 = bitmap::BitmapArray<long>::iterator::operator-(&local_58,&local_48);
    std::min<long>(&local_198,&local_1a0);
    local_190 = bitmap::BitmapArray<long>::iterator::operator-
                          (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                                        CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  CONCAT13(in_stack_fffffffffffffdb3,
                                                           CONCAT12(in_stack_fffffffffffffdb2,
                                                                    in_stack_fffffffffffffdb0)))))))
    ;
    local_1b0 = local_58.array_;
    local_1a8 = local_58.pos_;
    local_1c0 = local_18.array_;
    local_1b8 = local_18.pos_;
    first1_00.pos_ = in_stack_fffffffffffffdf0;
    first1_00.array_ = in_stack_fffffffffffffde8;
    last1.pos_ = (pos_type)in_stack_fffffffffffffde0;
    last1.array_ = in_stack_fffffffffffffdd8;
    first2_00.pos_ = (pos_type)in_stack_fffffffffffffdd0;
    first2_00.array_ = in_stack_fffffffffffffdc8;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_00,last1,first2_00);
    local_1e8 = bitmap::BitmapArray<long>::iterator::operator+
                          (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                                        CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  CONCAT13(in_stack_fffffffffffffdb3,
                                                           CONCAT12(in_stack_fffffffffffffdb2,
                                                                    in_stack_fffffffffffffdb0)))))))
    ;
    local_1d8 = bitmap::BitmapArray<long>::iterator::operator-(&local_1e8,&local_58);
    dVar4 = bitmap::BitmapArray<long>::iterator::operator-(&local_38,&local_78);
    local_1f0 = dVar4 + -1;
    std::min<long>(&local_1d8,&local_1f0);
    local_1d0 = bitmap::BitmapArray<long>::iterator::operator-
                          (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                                        CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  CONCAT13(in_stack_fffffffffffffdb3,
                                                           CONCAT12(in_stack_fffffffffffffdb2,
                                                                    in_stack_fffffffffffffdb0)))))))
    ;
    first1_01.pos_ = (pos_type)local_58.array_;
    first1_01.array_ = in_stack_fffffffffffffde8;
    last1_00.pos_ = (pos_type)in_stack_fffffffffffffde0;
    last1_00.array_ = in_stack_fffffffffffffdd8;
    first2_01.pos_ = (pos_type)in_stack_fffffffffffffdd0;
    first2_01.array_ = in_stack_fffffffffffffdc8;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_01,last1_00,first2_01);
    bitmap::BitmapArray<long>::iterator::operator-(&local_58,&local_48);
    bitmap::BitmapArray<long>::iterator::operator+
              (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                            CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffdb4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffdb3,
                                                  CONCAT12(in_stack_fffffffffffffdb2,
                                                           in_stack_fffffffffffffdb0)))))));
    bitmap::BitmapArray<long>::iterator::operator=
              (in_stack_00000020,(iterator *)&stack0xfffffffffffffde0);
    bitmap::BitmapArray<long>::iterator::operator+
              (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                            CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffdb4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffdb3,
                                                  CONCAT12(in_stack_fffffffffffffdb2,
                                                           in_stack_fffffffffffffdb0)))))));
    bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0xfffffffffffffdc0,&local_58);
    bitmap::BitmapArray<long>::iterator::operator-
              (this,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdb6,
                                            CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffdb4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffdb3,
                                                  CONCAT12(in_stack_fffffffffffffdb2,
                                                           in_stack_fffffffffffffdb0)))))));
    bitmap::BitmapArray<long>::iterator::operator=
              (in_stack_00000028,(iterator *)&stack0xfffffffffffffdd0);
  }
  else {
    bitmap::BitmapArray<long>::iterator::operator=(in_stack_00000020,&local_18);
    bitmap::BitmapArray<long>::iterator::operator=(in_stack_00000028,&local_38);
  }
  return bVar1;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}